

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

psa_status_t psa_close_key(psa_key_handle_t handle)

{
  psa_key_slot_t *local_20;
  psa_key_slot_t *slot;
  psa_key_handle_t local_e;
  psa_status_t status;
  psa_key_handle_t handle_local;
  
  if (handle == 0) {
    status = 0;
  }
  else {
    local_e = handle;
    slot._4_4_ = psa_get_key_slot(handle,&local_20);
    status = slot._4_4_;
    if (slot._4_4_ == 0) {
      status = psa_wipe_key_slot(local_20);
    }
  }
  return status;
}

Assistant:

psa_status_t psa_close_key( psa_key_handle_t handle )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    if( handle == 0 )
        return( PSA_SUCCESS );

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    return( psa_wipe_key_slot( slot ) );
}